

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_interface.cc
# Opt level: O1

void init_interface(module *m)

{
  PyObject *pPVar1;
  class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_> cVar2;
  class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *pcVar3;
  class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_> *cls;
  class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
  *this;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> _Var4;
  class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *pcVar5;
  handle hVar6;
  code *local_128;
  undefined8 local_120;
  code *local_118;
  undefined8 local_110;
  code *local_108;
  undefined8 local_100;
  offset_in_Var_to_subr local_f8 [4];
  class_<kratos::InterfaceModPortDefinition,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>
  local_d8;
  class_<kratos::InterfaceModPortDefinition,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>
  modport_interface;
  object local_c8;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_c0;
  class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_> local_b8;
  class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_> interface;
  class_<kratos::InterfaceRef,_std::shared_ptr<kratos::InterfaceRef>_> ref;
  handle local_a0;
  object local_98;
  undefined8 local_90;
  cpp_function local_88;
  cpp_function cf;
  unique_function_record unique_rec;
  cpp_function local_70;
  cpp_function cf_1;
  handle local_60;
  undefined8 local_58;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_50;
  unique_function_record unique_rec_2;
  cpp_function local_40;
  cpp_function cf_3;
  
  pybind11::class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_>::
  class_<>(&local_b8,(m->super_object).super_handle.m_ptr,"Interface");
  pybind11::class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            (&local_b8,"__init__",(type *)&cf,(is_new_style_constructor *)&local_70);
  cf.super_function.super_object.super_handle.m_ptr = (function)kratos::InterfaceDefinition::input;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int)>
                     ((class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>
                       *)&local_b8,"input",(offset_in_Var_to_subr *)&cf);
  local_70.super_function.super_object.super_handle.m_ptr =
       (function)kratos::InterfaceDefinition::output;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int)>
                     (pcVar3,"output",(offset_in_Var_to_subr *)&local_70);
  local_50._M_head_impl = (function_record *)kratos::InterfaceDefinition::var;
  unique_rec_2._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int)>
                     (pcVar3,"var",(offset_in_Var_to_subr *)&local_50);
  local_40.super_function.super_object.super_handle.m_ptr =
       (function)kratos::InterfaceDefinition::var;
  cf_3.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)>
                     (pcVar3,"var",(offset_in_Var_to_subr *)&local_40);
  local_60.m_ptr = (PyObject *)kratos::InterfaceDefinition::var;
  local_58 = 0;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int)>
                     (pcVar3,"var",(offset_in_Var_to_subr *)&local_60);
  local_98.super_handle.m_ptr = (handle)kratos::InterfaceDefinition::port;
  local_90 = 0;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int,kratos::PortDirection)>
                     (pcVar3,"port",(offset_in_Var_to_subr *)&local_98);
  local_d8.super_generic_type.super_object.super_handle.m_ptr =
       (generic_type)kratos::InterfaceDefinition::port;
  modport_interface.super_generic_type.super_object.super_handle.m_ptr = (generic_type)(object)0x0;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection)>
                     (pcVar3,"port",(offset_in_Var_to_subr *)&local_d8);
  interface.super_generic_type.super_object.super_handle.m_ptr =
       (generic_type)kratos::InterfaceDefinition::port;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection,kratos::PortType)>
                     (pcVar3,"port",(offset_in_Var_to_subr *)&interface);
  local_128 = kratos::InterfaceDefinition::clock;
  local_120 = 0;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)>
                     (pcVar3,"clock",(offset_in_Var_to_subr *)&local_128);
  local_118 = kratos::InterfaceDefinition::reset;
  local_110 = 0;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)>
                     (pcVar3,"reset",(offset_in_Var_to_subr *)&local_118);
  local_108 = kratos::InterfaceDefinition::create_modport_def;
  local_100 = 0;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::shared_ptr<kratos::InterfaceModPortDefinition>(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)>
                     (pcVar3,"modport",(offset_in_Var_to_subr *)&local_108);
  local_f8[0] = 9;
  local_f8[1] = 0;
  pcVar3 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<bool(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)const>
                     (pcVar3,"has_var",local_f8);
  local_f8[2] = 1;
  local_f8[3] = 0;
  cls = pybind11::class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
        def<bool(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)const>
                  (pcVar3,"has_port",local_f8 + 2);
  pPVar1 = (cls->super_generic_type).super_object.super_handle.m_ptr;
  local_c8.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_a0.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__contains__");
  if (local_a0.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_a0.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  hVar6.m_ptr = local_a0.m_ptr;
  local_88.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_c0);
  (local_c0._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_0,bool,kratos::InterfaceDefinition&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_interface(pybind11::module_&)::$_0&&,bool(*)(kratos::InterfaceDefinition&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_c0._M_head_impl)->name = "__contains__";
  (local_c0._M_head_impl)->field_0x59 = (local_c0._M_head_impl)->field_0x59 | 0x10;
  ((local_c0._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_c0._M_head_impl)->sibling).m_ptr = hVar6.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&local_88,(unique_function_record *)&local_c0,"({%}, {str}) -> bool",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_0,bool,kratos::InterfaceDefinition&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_interface(pybind11::module_&)::$_0&&,bool(*)(kratos::InterfaceDefinition&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_c0);
  pybind11::object::~object((object *)&local_a0);
  pybind11::object::~object(&local_c8);
  pybind11::detail::add_class_method((object *)cls,"__contains__",&local_88);
  pybind11::object::~object((object *)&local_88);
  pybind11::
  class_<kratos::InterfaceModPortDefinition,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>::
  class_<>(&local_d8,(m->super_object).super_handle.m_ptr,"ModPortInterface");
  cf.super_function.super_object.super_handle.m_ptr =
       (function)kratos::InterfaceModPortDefinition::set_input;
  this = (class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
          *)pybind11::
            class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
            ::def<void(kratos::InterfaceModPortDefinition::*)(std::__cxx11::string_const&)>
                      ((class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
                        *)&local_d8,"set_input",(offset_in_Var_to_subr *)&cf);
  local_70.super_function.super_object.super_handle.m_ptr =
       (function)kratos::InterfaceModPortDefinition::set_output;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::
  class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>::
  def<void(kratos::InterfaceModPortDefinition::*)(std::__cxx11::string_const&)>
            (this,"set_output",(offset_in_Var_to_subr *)&local_70);
  pybind11::class_<kratos::InterfaceRef,_std::shared_ptr<kratos::InterfaceRef>_>::class_<>
            ((class_<kratos::InterfaceRef,_std::shared_ptr<kratos::InterfaceRef>_> *)&interface,
             (m->super_object).super_handle.m_ptr,"InterfaceRef");
  cVar2 = interface;
  local_40.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  _Var4._M_head_impl =
       (function_record *)
       PyObject_GetAttrString(interface.super_generic_type.super_object.super_handle.m_ptr,"var");
  if (_Var4._M_head_impl == (function_record *)0x0) {
    PyErr_Clear();
    local_50._M_head_impl = (function_record *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    _Var4._M_head_impl = local_50._M_head_impl;
  }
  local_50._M_head_impl = _Var4._M_head_impl;
  _Var4._M_head_impl = local_50._M_head_impl;
  local_70.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_1,kratos::Var&,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_1&&,kratos::Var&(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "var";
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x10;
  ((generic_type *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70))->super_object =
       (object)cVar2.super_generic_type.super_object.super_handle.m_ptr;
  *(function_record **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) =
       _Var4._M_head_impl;
  *(undefined1 *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x58) = 5;
  pybind11::cpp_function::initialize_generic
            (&local_70,(unique_function_record *)&cf,"({%}, {str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_1,kratos::Var&,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_1&&,kratos::Var&(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object((object *)&local_40);
  pybind11::detail::add_class_method((object *)&interface,"var",&local_70);
  pybind11::object::~object((object *)&local_70);
  cVar2 = interface;
  local_40.super_function.super_object.super_handle.m_ptr = (function)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  _Var4._M_head_impl =
       (function_record *)
       PyObject_GetAttrString(interface.super_generic_type.super_object.super_handle.m_ptr,"port");
  if (_Var4._M_head_impl == (function_record *)0x0) {
    PyErr_Clear();
    local_50._M_head_impl = (function_record *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    _Var4._M_head_impl = local_50._M_head_impl;
  }
  local_50._M_head_impl = _Var4._M_head_impl;
  _Var4._M_head_impl = local_50._M_head_impl;
  local_70.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record(&cf);
  *(code **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x30) =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_2,kratos::Port&,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_2&&,kratos::Port&(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)cf.super_function.super_object.super_handle.m_ptr = "port";
  *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) =
       *(byte *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x59) | 0x10;
  ((generic_type *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x70))->super_object =
       (object)cVar2.super_generic_type.super_object.super_handle.m_ptr;
  *(function_record **)((long)cf.super_function.super_object.super_handle.m_ptr + 0x78) =
       _Var4._M_head_impl;
  *(undefined1 *)((long)cf.super_function.super_object.super_handle.m_ptr + 0x58) = 5;
  pybind11::cpp_function::initialize_generic
            (&local_70,(unique_function_record *)&cf,"({%}, {str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_2,kratos::Port&,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_2&&,kratos::Port&(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&cf);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object((object *)&local_40);
  pybind11::detail::add_class_method((object *)&interface,"port",&local_70);
  pybind11::object::~object((object *)&local_70);
  cf.super_function.super_object.super_handle.m_ptr = (function)kratos::InterfaceRef::has_var;
  pcVar5 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<bool(kratos::InterfaceRef::*)(std::__cxx11::string_const&)const>
                     ((class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
                      &interface,"has_var",(offset_in_Var_to_subr *)&cf);
  local_70.super_function.super_object.super_handle.m_ptr = (function)kratos::InterfaceRef::has_port
  ;
  cf_1.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pcVar5 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<bool(kratos::InterfaceRef::*)(std::__cxx11::string_const&)const>
                     (pcVar5,"has_port",(offset_in_Var_to_subr *)&local_70);
  pPVar1 = *(PyObject **)pcVar5;
  local_98.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar6.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__contains__");
  if (hVar6.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar6.m_ptr = local_60.m_ptr;
  }
  local_60.m_ptr = hVar6.m_ptr;
  hVar6.m_ptr = local_60.m_ptr;
  local_40.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_3,bool,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_interface(pybind11::module_&)::$_3&&,bool(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_50._M_head_impl)->name = "__contains__";
  (local_50._M_head_impl)->field_0x59 = (local_50._M_head_impl)->field_0x59 | 0x10;
  ((local_50._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_50._M_head_impl)->sibling).m_ptr = hVar6.m_ptr;
  pybind11::cpp_function::initialize_generic
            (&local_40,(unique_function_record *)&local_50,"({%}, {str}) -> bool",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_3,bool,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_interface(pybind11::module_&)::$_3&&,bool(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  pybind11::object::~object((object *)&local_60);
  pybind11::object::~object(&local_98);
  pybind11::detail::add_class_method((object *)pcVar5,"__contains__",&local_40);
  pybind11::object::~object((object *)&local_40);
  pPVar1 = *(PyObject **)pcVar5;
  local_98.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar6.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__getitem__");
  if (hVar6.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar6.m_ptr = local_60.m_ptr;
  }
  local_60.m_ptr = hVar6.m_ptr;
  hVar6.m_ptr = local_60.m_ptr;
  local_40.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_4,kratos::Var*,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_4&&,kratos::Var*(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_50._M_head_impl)->name = "__getitem__";
  (local_50._M_head_impl)->field_0x59 = (local_50._M_head_impl)->field_0x59 | 0x10;
  ((local_50._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_50._M_head_impl)->sibling).m_ptr = hVar6.m_ptr;
  (local_50._M_head_impl)->policy = reference;
  pybind11::cpp_function::initialize_generic
            (&local_40,(unique_function_record *)&local_50,"({%}, {str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_4,kratos::Var*,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_4&&,kratos::Var*(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  pybind11::object::~object((object *)&local_60);
  pybind11::object::~object(&local_98);
  pybind11::detail::add_class_method((object *)pcVar5,"__getitem__",&local_40);
  pybind11::object::~object((object *)&local_40);
  pPVar1 = *(PyObject **)pcVar5;
  local_98.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar6.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"__getattr__");
  if (hVar6.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_60.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar6.m_ptr = local_60.m_ptr;
  }
  local_60.m_ptr = hVar6.m_ptr;
  hVar6.m_ptr = local_60.m_ptr;
  local_40.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_50);
  (local_50._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<init_interface(pybind11::module_&)::$_5,kratos::Var*,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_5&&,kratos::Var*(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_50._M_head_impl)->name = "__getattr__";
  (local_50._M_head_impl)->field_0x59 = (local_50._M_head_impl)->field_0x59 | 0x10;
  ((local_50._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_50._M_head_impl)->sibling).m_ptr = hVar6.m_ptr;
  (local_50._M_head_impl)->policy = reference;
  pybind11::cpp_function::initialize_generic
            (&local_40,(unique_function_record *)&local_50,"({%}, {str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_interface(pybind11::module_&)::$_5,kratos::Var*,kratos::InterfaceRef&,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(init_interface(pybind11::module_&)::$_5&&,kratos::Var*(*)(kratos::InterfaceRef&,std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
             ::types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_50);
  pybind11::object::~object((object *)&local_60);
  pybind11::object::~object(&local_98);
  pybind11::detail::add_class_method((object *)pcVar5,"__getattr__",&local_40);
  pybind11::object::~object((object *)&local_40);
  local_50._M_head_impl = (function_record *)kratos::InterfaceRef::has_modport;
  unique_rec_2._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          )0x0;
  pcVar5 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<bool(kratos::InterfaceRef::*)(std::__cxx11::string_const&)>
                     (pcVar5,"has_modport",(offset_in_Var_to_subr *)&local_50);
  local_40.super_function.super_object.super_handle.m_ptr =
       (function)kratos::InterfaceRef::get_modport_ref;
  cf_3.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
  pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
  def<std::shared_ptr<kratos::InterfaceRef>(kratos::InterfaceRef::*)(std::__cxx11::string_const&)>
            (pcVar5,"get_modport_ref",(offset_in_Var_to_subr *)&local_40);
  pybind11::object::~object((object *)&interface);
  pybind11::object::~object((object *)&local_d8);
  pybind11::object::~object((object *)&local_b8);
  return;
}

Assistant:

void init_interface(py::module &m) {
    using namespace kratos;
    auto interface =
        py::class_<InterfaceDefinition, std::shared_ptr<InterfaceDefinition>>(m, "Interface");
    interface.def(py::init<const std::string &>())
        .def("input", &InterfaceDefinition::input)
        .def("output", &InterfaceDefinition::output)
        .def("var",
             py::overload_cast<const std::string &, uint32_t, uint32_t>(&InterfaceDefinition::var))
        .def("var", py::overload_cast<const std::string &, uint32_t, const std::vector<uint32_t> &>(
                        &InterfaceDefinition::var))
        .def("var", py::overload_cast<const std::string &, uint32_t>(&InterfaceDefinition::var))
        .def("port", py::overload_cast<const std::string &, uint32_t, uint32_t, PortDirection>(
                         &InterfaceDefinition::port))
        .def("port", py::overload_cast<const std::string &, uint32_t, const std::vector<uint32_t> &,
                                       PortDirection>(&InterfaceDefinition::port))
        .def("port", py::overload_cast<const std::string &, uint32_t, const std::vector<uint32_t> &,
                                       PortDirection, PortType>(&InterfaceDefinition::port))
        .def("clock", &InterfaceDefinition::clock)
        .def("reset", &InterfaceDefinition::reset)
        .def("modport", &InterfaceDefinition::create_modport_def)
        .def("has_var", &InterfaceDefinition::has_var)
        .def("has_port", &InterfaceDefinition::has_port)
        .def("__contains__", [](InterfaceDefinition &def, const std::string &name) {
            return def.has_port(name) || def.has_var(name);
        });

    auto modport_interface =
        py::class_<InterfaceModPortDefinition, std::shared_ptr<InterfaceModPortDefinition>>(
            m, "ModPortInterface");
    modport_interface.def("set_input", &InterfaceModPortDefinition::set_input)
        .def("set_output", &InterfaceModPortDefinition::set_output);

    auto ref = py::class_<InterfaceRef, std::shared_ptr<InterfaceRef>>(m, "InterfaceRef");
    ref.def(
           "var", [](InterfaceRef &ref, const std::string &name) -> Var & { return ref.var(name); },
           py::return_value_policy::reference)
        .def(
            "port",
            [](InterfaceRef &ref, const std::string &name) -> Port & { return ref.port(name); },
            py::return_value_policy::reference)
        .def("has_var", &InterfaceRef::has_var)
        .def("has_port", &InterfaceRef::has_port)
        .def("__contains__",
             [](InterfaceRef &ref, const std::string &name) {
                 return ref.has_port(name) || ref.has_var(name);
             })
        .def(
            "__getitem__",
            [](InterfaceRef &ref, const std::string &name) -> Var * {
                if (ref.has_port(name)) {
                    return &ref.port(name);
                } else if (ref.has_var(name)) {
                    return &ref.var(name);
                } else {
                    throw UserException(name + " not exist in " + ref.name());
                }
            },
            py::return_value_policy::reference)
        .def(
            "__getattr__",
            [](InterfaceRef &ref, const std::string &name) -> Var * {
                if (ref.has_port(name)) {
                    return &ref.port(name);
                } else if (ref.has_var(name)) {
                    return &ref.var(name);
                } else if (name == "__len__") {
                    return nullptr;
                } else {
                    throw UserException(name + " not exist in " + ref.name());
                }
            },
            py::return_value_policy::reference)
        .def("has_modport", &InterfaceRef::has_modport)
        .def("get_modport_ref", &InterfaceRef::get_modport_ref);
}